

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O3

HT_Mutex * ht_mutex_create(void)

{
  HT_Mutex *pHVar1;
  
  pHVar1 = (HT_Mutex *)ht_alloc(0x28);
  if (pHVar1 != (HT_Mutex *)0x0) {
    *(undefined8 *)((long)&(pHVar1->mtx).super___mutex_base._M_mutex + 0x10) = 0;
    (pHVar1->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    (pHVar1->mtx).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pHVar1->mtx).super___mutex_base._M_mutex + 8) = 0;
    (pHVar1->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  }
  return pHVar1;
}

Assistant:

HT_Mutex*
ht_mutex_create(void)
{
    HT_Mutex* mtx = HT_CREATE_TYPE(HT_Mutex);

    if (mtx == NULL)
    {
        return NULL;
    }

#ifdef HT_MUTEX_IMPL_CPP11
    new (&mtx->mtx) std::mutex();
#elif defined(HT_MUTEX_IMPL_POSIX)
    pthread_mutex_init(&mtx->mtx, NULL);
#elif defined(HT_MUTEX_IMPL_WIN32)
    mtx->mtx = CreateMutex(0, FALSE, 0);
#endif

    return mtx;
}